

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                     double threshold)

{
  int iVar1;
  HistogramPair *pHVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  HistogramPair pair;
  HistogramPair local_28;
  
  uVar3 = 0;
  uVar4 = 0;
  if (histo_queue->size != histo_queue->max_size) {
    local_28.idx2 = idx2;
    if (idx2 < idx1) {
      local_28.idx2 = idx1;
    }
    if (idx1 < idx2) {
      idx2 = idx1;
    }
    local_28.idx1 = idx2;
    HistoQueueUpdatePair(histograms[idx2],histograms[local_28.idx2],threshold,&local_28);
    uVar3 = 0;
    uVar4 = 0;
    if (local_28.cost_diff < threshold) {
      pHVar2 = histo_queue->queue;
      iVar1 = histo_queue->size;
      histo_queue->size = iVar1 + 1;
      pHVar2[iVar1].cost_combo = local_28.cost_combo;
      pHVar2 = pHVar2 + iVar1;
      pHVar2->idx1 = local_28.idx1;
      pHVar2->idx2 = local_28.idx2;
      pHVar2->cost_diff = local_28.cost_diff;
      HistoQueueUpdateHead(histo_queue,histo_queue->queue + (long)histo_queue->size + -1);
      uVar3 = SUB84(local_28.cost_diff,0);
      uVar4 = (undefined4)((ulong)local_28.cost_diff >> 0x20);
    }
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

static double HistoQueuePush(HistoQueue* const histo_queue,
                             VP8LHistogram** const histograms, int idx1,
                             int idx2, double threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0.;
  assert(threshold <= 0.);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  HistoQueueUpdatePair(h1, h2, threshold, &pair);

  // Do not even consider the pair if it does not improve the entropy.
  if (pair.cost_diff >= threshold) return 0.;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}